

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleLightNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  pointer *pppaVar1;
  iterator __position;
  pointer ppaVar2;
  ai_uint32 aVar3;
  aiLight *paVar4;
  aiNode *this_00;
  size_t sVar5;
  char *__s;
  aiLight *light;
  aiLight *local_28;
  
  paVar4 = (aiLight *)operator_new(0x46c);
  (paVar4->mName).length = 0;
  (paVar4->mName).data[0] = '\0';
  memset((paVar4->mName).data + 1,0x1b,0x3ff);
  paVar4->mType = aiLightSource_UNDEFINED;
  (paVar4->mPosition).x = 0.0;
  (paVar4->mPosition).y = 0.0;
  (paVar4->mPosition).z = 0.0;
  (paVar4->mDirection).x = 0.0;
  (paVar4->mDirection).y = 0.0;
  *(undefined8 *)&(paVar4->mDirection).z = 0;
  (paVar4->mUp).x = 0.0;
  (paVar4->mUp).y = 0.0;
  *(undefined8 *)&(paVar4->mUp).z = 0;
  paVar4->mAttenuationLinear = 1.0;
  paVar4->mAttenuationQuadratic = 0.0;
  (paVar4->mColorDiffuse).r = 0.0;
  (paVar4->mColorDiffuse).g = 0.0;
  (paVar4->mColorDiffuse).b = 0.0;
  (paVar4->mColorSpecular).r = 0.0;
  (paVar4->mColorSpecular).g = 0.0;
  *(undefined8 *)&(paVar4->mColorSpecular).b = 0;
  (paVar4->mColorAmbient).g = 0.0;
  (paVar4->mColorAmbient).b = 0.0;
  paVar4->mAngleInnerCone = 6.2831855;
  paVar4->mAngleOuterCone = 6.2831855;
  (paVar4->mSize).x = 0.0;
  (paVar4->mSize).y = 0.0;
  __position._M_current =
       (this->m_lightCache).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28 = paVar4;
  if (__position._M_current ==
      (this->m_lightCache).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiLight*,std::allocator<aiLight*>>::_M_realloc_insert<aiLight*const&>
              ((vector<aiLight*,std::allocator<aiLight*>> *)&this->m_lightCache,__position,&local_28
              );
  }
  else {
    *__position._M_current = paVar4;
    pppaVar1 = &(this->m_lightCache).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  this->m_currentLight = local_28;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  this->m_tokenType = 7;
  this->m_currentNode = this_00;
  pushNode(this,this_00,pScene);
  handleNodes(this,node,pScene);
  ppaVar2 = (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppaVar2) {
    (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar2 + -1;
  }
  __s = (this_00->mName).data;
  sVar5 = strlen(__s);
  aVar3 = (ai_uint32)sVar5;
  if ((int)aVar3 < 0x400) {
    paVar4 = this->m_currentLight;
    (paVar4->mName).length = aVar3;
    memcpy((paVar4->mName).data,__s,(long)(int)aVar3);
    (paVar4->mName).data[(int)aVar3] = '\0';
  }
  return;
}

Assistant:

void OpenGEXImporter::handleLightNode( ODDLParser::DDLNode *node, aiScene *pScene ) {
    aiLight *light( new aiLight );
    m_lightCache.push_back( light );
    m_currentLight = light;

    aiNode *newNode = new aiNode;
    m_tokenType = Grammar::LightNodeToken;
    m_currentNode = newNode;
    pushNode( newNode, pScene );

    handleNodes( node, pScene );

    popNode();

    m_currentLight->mName.Set( newNode->mName.C_Str() );
}